

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O3

void Amap_LibVerifyPerm(Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,
                       int *pArray)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vec_Int_t *__ptr;
  Amap_Nod_t *pAVar7;
  int *piVar8;
  void *pvVar9;
  ulong uVar10;
  uint *__ptr_00;
  Vec_Ptr_t *vTtElems;
  void **ppvVar11;
  uint *puVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int nWords;
  uint uVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  int iInput;
  uint local_64;
  ulong local_60;
  Kit_DsdNtk_t *local_58;
  Vec_Int_t *local_50;
  Amap_Lib_t *local_48;
  Amap_Nod_t *local_40;
  int *local_38;
  long lVar25;
  
  local_64 = 0;
  uVar17 = *(uint *)&pGate->field_0x38;
  local_58 = pNtk;
  local_48 = pLib;
  local_40 = pNod;
  local_38 = pArray;
  if (uVar17 < 0x2000000) {
    __assert_fail("pGate->nPins > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x122,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  uVar16 = uVar17 >> 0x18;
  uVar20 = (ulong)uVar16;
  bVar13 = (char)(uVar17 >> 0x18) - 5;
  uVar21 = 0xf << (bVar13 & 0x1f);
  if (uVar21 < 0x11) {
    uVar21 = 0x10;
  }
  local_50 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 1 << (bVar13 & 0x1f);
  if (uVar17 < 0x6000000) {
    uVar3 = 1;
  }
  if (uVar17 < 0x6000000) {
    uVar21 = 0x10;
  }
  local_50->nSize = 0;
  local_50->nCap = uVar21;
  piVar8 = (int *)malloc((long)(int)uVar21 << 2);
  local_50->pArray = piVar8;
  pvVar9 = malloc(((long)(int)uVar3 * 4 + 8) * uVar20);
  uVar10 = (ulong)(uVar16 * 8);
  uVar14 = 0;
  do {
    *(ulong *)((long)pvVar9 + uVar14 * 8) = (long)pvVar9 + uVar10;
    uVar14 = uVar14 + 1;
    uVar10 = uVar10 + (long)(int)uVar3 * 4;
  } while (uVar20 != uVar14);
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[1] = uVar16;
  *__ptr_00 = uVar16;
  *(void **)(__ptr_00 + 2) = pvVar9;
  auVar6 = _DAT_008403e0;
  auVar5 = _DAT_008403d0;
  auVar4 = _DAT_008403c0;
  lVar15 = (ulong)uVar3 - 1;
  auVar22._8_4_ = (int)lVar15;
  auVar22._0_8_ = lVar15;
  auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
  uVar10 = 0;
  auVar22 = auVar22 ^ _DAT_008403e0;
  do {
    lVar15 = *(long *)((long)pvVar9 + uVar10 * 8);
    iVar19 = auVar22._0_4_;
    iVar23 = auVar22._4_4_;
    if (uVar10 < 5) {
      if (0 < (int)uVar3) {
        uVar1 = (&DAT_008b50a0)[uVar10];
        lVar18 = 0;
        auVar24 = auVar5;
        auVar26 = auVar4;
        do {
          auVar27 = auVar24 ^ auVar6;
          if ((bool)(~(auVar27._4_4_ == iVar23 && iVar19 < auVar27._0_4_ || iVar23 < auVar27._4_4_)
                    & 1)) {
            *(undefined4 *)(lVar15 + lVar18) = uVar1;
          }
          if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
              auVar27._12_4_ <= auVar22._12_4_) {
            *(undefined4 *)(lVar15 + 4 + lVar18) = uVar1;
          }
          iVar28 = SUB164(auVar26 ^ auVar6,4);
          if (iVar28 <= iVar23 && (iVar28 != iVar23 || SUB164(auVar26 ^ auVar6,0) <= iVar19)) {
            *(undefined4 *)(lVar15 + 8 + lVar18) = uVar1;
            *(undefined4 *)(lVar15 + 0xc + lVar18) = uVar1;
          }
          lVar25 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 4;
          auVar24._8_8_ = lVar25 + 4;
          lVar25 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 4;
          auVar26._8_8_ = lVar25 + 4;
          lVar18 = lVar18 + 0x10;
        } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar18);
      }
    }
    else if (0 < (int)uVar3) {
      uVar17 = 1 << ((char)uVar10 - 5U & 0x1f);
      uVar14 = 0;
      auVar27 = auVar5;
      do {
        bVar2 = iVar19 < SUB164(auVar27 ^ auVar6,0);
        iVar28 = SUB164(auVar27 ^ auVar6,4);
        if ((bool)(~(iVar23 < iVar28 || iVar28 == iVar23 && bVar2) & 1)) {
          *(uint *)(lVar15 + uVar14 * 4) = -(uint)((uVar17 & (uint)uVar14) != 0);
        }
        if (iVar23 >= iVar28 && (iVar28 != iVar23 || !bVar2)) {
          *(uint *)(lVar15 + 4 + uVar14 * 4) = -(uint)(((uint)uVar14 + 1 & uVar17) != 0);
        }
        uVar14 = uVar14 + 2;
        lVar18 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 2;
        auVar27._8_8_ = lVar18 + 2;
      } while ((uVar3 + 1 & 0xfffffffe) != uVar14);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar20);
  uVar17 = *(uint *)&pGate->field_0x38;
  uVar10 = (ulong)(uVar17 >> 0x18);
  local_60 = (ulong)uVar3;
  vTtElems = (Vec_Ptr_t *)malloc(0x10);
  uVar20 = 8;
  if (6 < (uVar17 >> 0x18) - 1) {
    uVar20 = uVar10;
  }
  vTtElems->nSize = 0;
  iVar19 = (int)uVar20;
  vTtElems->nCap = iVar19;
  if (iVar19 == 0) {
    ppvVar11 = (void **)0x0;
  }
  else {
    ppvVar11 = (void **)malloc((ulong)(uint)(iVar19 * 8));
  }
  vTtElems->pArray = ppvVar11;
  if (0xffffff < uVar17) {
    uVar14 = 0;
    do {
      uVar21 = local_38[uVar14];
      if ((int)uVar21 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (uVar16 <= uVar21 >> 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar9 = *(void **)(*(long *)(__ptr_00 + 2) + (ulong)(uVar21 >> 1) * 8);
      if ((uVar21 & 1) != 0) {
        uVar21 = 1 << ((char)uVar10 - 5U & 0x1f);
        if (uVar17 < 0x6000000) {
          uVar21 = 1;
        }
        if (0 < (int)uVar21) {
          uVar10 = (ulong)uVar21 + 1;
          do {
            puVar12 = (uint *)((long)pvVar9 + uVar10 * 4 + -8);
            *puVar12 = ~*puVar12;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      iVar19 = (int)uVar20;
      if ((int)uVar14 == iVar19) {
        if (iVar19 < 0x10) {
          if (vTtElems->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc(0x80);
          }
          else {
            ppvVar11 = (void **)realloc(vTtElems->pArray,0x80);
          }
          vTtElems->pArray = ppvVar11;
          vTtElems->nCap = 0x10;
          uVar20 = 0x10;
        }
        else {
          uVar20 = (ulong)(uint)(iVar19 * 2);
          if (vTtElems->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc(uVar20 * 8);
          }
          else {
            ppvVar11 = (void **)realloc(vTtElems->pArray,uVar20 * 8);
          }
          vTtElems->pArray = ppvVar11;
          vTtElems->nCap = iVar19 * 2;
        }
      }
      else {
        ppvVar11 = vTtElems->pArray;
      }
      uVar10 = uVar14 & 0xffffffff;
      uVar14 = uVar14 + 1;
      vTtElems->nSize = (int)uVar14;
      ppvVar11[uVar10] = pvVar9;
      uVar17 = *(uint *)&pGate->field_0x38;
      uVar10 = (ulong)(uVar17 >> 0x18);
    } while (uVar14 < uVar10);
  }
  pAVar7 = local_40;
  __ptr = local_50;
  puVar12 = Amap_LibVerifyPerm_rec
                      (local_48,local_40,vTtElems,local_50,(int)local_60,(int *)&local_64);
  uVar17 = *(uint *)&pGate->field_0x38;
  uVar21 = uVar17 >> 0x18;
  if (local_64 != uVar21) {
    __assert_fail("iInput == (int)pGate->nPins",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x132,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  if ((local_58->Root & 1) != 0) {
    uVar16 = 1 << ((char)local_64 - 5U & 0x1f);
    if (uVar17 < 0x6000000) {
      uVar16 = 1;
    }
    if (0 < (int)uVar16) {
      uVar20 = (ulong)uVar16 + 1;
      do {
        puVar12[uVar20 - 2] = ~puVar12[uVar20 - 2];
        uVar20 = uVar20 - 1;
      } while (1 < uVar20);
      uVar17 = *(uint *)&pGate->field_0x38;
      uVar21 = uVar17 >> 0x18;
    }
  }
  uVar20 = (ulong)(uint)(1 << ((char)uVar21 - 5U & 0x1f));
  if (uVar17 < 0x6000000) {
    uVar20 = 1;
  }
  do {
    if ((int)uVar20 < 1) goto LAB_003cae7f;
    lVar15 = uVar20 - 1;
    lVar18 = uVar20 - 1;
    uVar20 = uVar20 - 1;
  } while (pGate->pFunc[lVar15] == puVar12[lVar18]);
  printf("Verification failed for gate %d (%s) and node %d.\n",(ulong)(uVar17 & 0x7fffff),
         pGate->pForm,(ulong)*(ushort *)pAVar7);
LAB_003cae7f:
  piVar8 = __ptr->pArray;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  if (vTtElems->pArray != (void **)0x0) {
    free(vTtElems->pArray);
  }
  free(vTtElems);
  return;
}

Assistant:

void Amap_LibVerifyPerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, int * pArray )
{
    Vec_Ptr_t * vTtElems;
    Vec_Ptr_t * vTtElemsPol;
    Vec_Int_t * vTruth;
    unsigned * pTruth;
    int i, nWords;
    int iInput = 0;

    // allocate storage for truth tables
    assert( pGate->nPins > 1 );
    nWords = Kit_TruthWordNum( pGate->nPins );
    vTruth = Vec_IntAlloc( nWords * AMAP_MAXINS );
    vTtElems = Vec_PtrAllocTruthTables( pGate->nPins );
    vTtElemsPol = Vec_PtrAlloc( pGate->nPins );
    for ( i = 0; i < (int)pGate->nPins; i++ )
    {
        pTruth = (unsigned *)Vec_PtrEntry( vTtElems, Abc_Lit2Var(pArray[i]) );
        if ( Abc_LitIsCompl( pArray[i] ) )
            Kit_TruthNot( pTruth, pTruth, pGate->nPins );
        Vec_PtrPush( vTtElemsPol, pTruth );
    }
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 0), 4 ); printf("\n" );
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 1), 4 ); printf("\n" );
    // compute the truth table recursively
    pTruth = Amap_LibVerifyPerm_rec( pLib, pNod, vTtElemsPol, vTruth, nWords, &iInput );
    assert( iInput == (int)pGate->nPins );
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruth, pTruth, pGate->nPins );
//Extra_PrintBinary( stdout, pTruth, 4 ); printf("\n" );
//Extra_PrintBinary( stdout, pGate->pFunc, 4 ); printf("\n" );
    // compare
    if ( !Kit_TruthIsEqual(pGate->pFunc, pTruth, pGate->nPins) )
        printf( "Verification failed for gate %d (%s) and node %d.\n",
            pGate->Id, pGate->pForm, pNod->Id );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vTtElems );
    Vec_PtrFree( vTtElemsPol );
}